

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

unsigned_long generate_hash_secret_salt(XML_Parser parser)

{
  int iVar1;
  __pid_t _Var2;
  unsigned_long uVar3;
  unsigned_long local_20;
  unsigned_long entropy;
  XML_Parser parser_local;
  
  entropy = (unsigned_long)parser;
  iVar1 = writeRandomBytes_getrandom_nonblock(&local_20,8);
  if (iVar1 == 0) {
    iVar1 = writeRandomBytes_dev_urandom(&local_20,8);
    if (iVar1 == 0) {
      uVar3 = gather_time_entropy();
      _Var2 = getpid();
      local_20 = uVar3 ^ (long)_Var2;
      parser_local = (XML_Parser)ENTROPY_DEBUG("fallback(8)",local_20 * 0x1fffffffffffffff);
    }
    else {
      parser_local = (XML_Parser)ENTROPY_DEBUG("/dev/urandom",local_20);
    }
  }
  else {
    parser_local = (XML_Parser)ENTROPY_DEBUG("getrandom",local_20);
  }
  return (unsigned_long)parser_local;
}

Assistant:

static unsigned long
generate_hash_secret_salt(XML_Parser parser) {
  unsigned long entropy;
  (void)parser;

  /* "Failproof" high quality providers: */
#if defined(HAVE_ARC4RANDOM_BUF)
  arc4random_buf(&entropy, sizeof(entropy));
  return ENTROPY_DEBUG("arc4random_buf", entropy);
#elif defined(HAVE_ARC4RANDOM)
  writeRandomBytes_arc4random((void *)&entropy, sizeof(entropy));
  return ENTROPY_DEBUG("arc4random", entropy);
#else
  /* Try high quality providers first .. */
#  ifdef _WIN32
  if (writeRandomBytes_rand_s((void *)&entropy, sizeof(entropy))) {
    return ENTROPY_DEBUG("rand_s", entropy);
  }
#  elif defined(HAVE_GETRANDOM) || defined(HAVE_SYSCALL_GETRANDOM)
  if (writeRandomBytes_getrandom_nonblock((void *)&entropy, sizeof(entropy))) {
    return ENTROPY_DEBUG("getrandom", entropy);
  }
#  endif
#  if ! defined(_WIN32) && defined(XML_DEV_URANDOM)
  if (writeRandomBytes_dev_urandom((void *)&entropy, sizeof(entropy))) {
    return ENTROPY_DEBUG("/dev/urandom", entropy);
  }
#  endif /* ! defined(_WIN32) && defined(XML_DEV_URANDOM) */
  /* .. and self-made low quality for backup: */

  /* Process ID is 0 bits entropy if attacker has local access */
  entropy = gather_time_entropy() ^ getpid();

  /* Factors are 2^31-1 and 2^61-1 (Mersenne primes M31 and M61) */
  if (sizeof(unsigned long) == 4) {
    return ENTROPY_DEBUG("fallback(4)", entropy * 2147483647);
  } else {
    return ENTROPY_DEBUG("fallback(8)",
                         entropy * (unsigned long)2305843009213693951ULL);
  }
#endif
}